

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O2

int amqp_connection_get_cbs_handle(AMQP_CONNECTION_HANDLE conn_handle,CBS_HANDLE *cbs_handle)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (conn_handle == (AMQP_CONNECTION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x1b3;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x1b3;
    }
    pcVar4 = "amqp_connection_get_cbs_handle failed (conn_handle is NULL)";
    iVar2 = 0x1b4;
  }
  else if (cbs_handle == (CBS_HANDLE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x1b8;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x1b8;
    }
    pcVar4 = "amqp_connection_get_cbs_handle failed (parameter cbs_handle is NULL)";
    iVar2 = 0x1b9;
  }
  else {
    if (conn_handle->cbs_handle != (CBS_HANDLE)0x0) {
      *cbs_handle = conn_handle->cbs_handle;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x1c1;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x1c1;
    }
    pcVar4 = "amqp_connection_get_cbs_handle failed (there is not a cbs_handle to be returned)";
    iVar2 = 0x1c2;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
            ,"amqp_connection_get_cbs_handle",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int amqp_connection_get_cbs_handle(AMQP_CONNECTION_HANDLE conn_handle, CBS_HANDLE* cbs_handle)
{
    int result;

    if (conn_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("amqp_connection_get_cbs_handle failed (conn_handle is NULL)");
    }
    else if (cbs_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("amqp_connection_get_cbs_handle failed (parameter cbs_handle is NULL)");
    }
    else
    {
        AMQP_CONNECTION_INSTANCE* instance = (AMQP_CONNECTION_INSTANCE*)conn_handle;

        if (instance->cbs_handle == NULL)
        {
            result = MU_FAILURE;
            LogError("amqp_connection_get_cbs_handle failed (there is not a cbs_handle to be returned)");
        }
        else
        {
            *cbs_handle = instance->cbs_handle;

            result = RESULT_OK;
        }
    }

    return result;
}